

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

int wally_base58_to_bytes(char *str_in,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  uint32_t uVar1;
  size_t base58_len;
  size_t bytes_len;
  int ret;
  uint32_t checksum;
  size_t offset;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  char *str_in_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((str_in == (char *)0x0) || ((flags & 0xfffffffe) != 0)) || (bytes_out == (uchar *)0x0)) ||
     ((len == 0 || (written == (size_t *)0x0)))) {
    str_in_local._4_4_ = -2;
  }
  else if (((flags & 1) == 0) || (4 < len)) {
    *written = len;
    base58_len = strlen(str_in);
    str_in_local._4_4_ = base58_decode(str_in,base58_len,bytes_out,written);
    if ((str_in_local._4_4_ == 0) && (len < *written)) {
      str_in_local._4_4_ = 0;
    }
    else if ((str_in_local._4_4_ == 0) && ((flags & 1) != 0)) {
      if (*written < 5) {
        wally_clear(bytes_out,len);
        str_in_local._4_4_ = -2;
      }
      else {
        bytes_len = *written - 4;
        uVar1 = base58_get_checksum(bytes_out,bytes_len);
        if (*(uint32_t *)(bytes_out + bytes_len) == uVar1) {
          wally_clear(bytes_out + bytes_len,4);
          *written = *written - 4;
        }
        else {
          wally_clear(bytes_out,len);
          str_in_local._4_4_ = -2;
        }
      }
    }
  }
  else {
    str_in_local._4_4_ = -2;
  }
  return str_in_local._4_4_;
}

Assistant:

int wally_base58_to_bytes(const char *str_in, uint32_t flags,
                          unsigned char *bytes_out, size_t len,
                          size_t *written)
{
    size_t offset;
    uint32_t checksum;
    int ret;

    if (written)
        *written = 0;

    if (!str_in || flags & ~BASE58_ALL_DEFINED_FLAGS ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & BASE58_FLAG_CHECKSUM && len <= BASE58_CHECKSUM_LEN)
        return WALLY_EINVAL; /* No room for checksum */

    *written = len;
    ret = base58_decode(str_in, strlen(str_in), bytes_out, written);
    if (!ret && *written > len)
        return WALLY_OK; /* not enough space, return required amount */

    if (!ret && (flags & BASE58_FLAG_CHECKSUM)) {
        if (*written <= BASE58_CHECKSUM_LEN) {
            wally_clear(bytes_out, len);
            return WALLY_EINVAL; /* Input not long enough to contain a checksum */
        }

        offset = *written - BASE58_CHECKSUM_LEN;
        checksum = base58_get_checksum(bytes_out, offset);

        if (memcmp(bytes_out + offset, &checksum, sizeof(checksum))) {
            wally_clear(bytes_out, len);
            return WALLY_EINVAL; /* Checksum mismatch */
        }

        wally_clear(bytes_out + offset, BASE58_CHECKSUM_LEN);
        *written -= BASE58_CHECKSUM_LEN;
    }
    return ret;
}